

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rtreedepth(sqlite3_context *ctx,int nArg,sqlite3_value **apArg)

{
  int iVar1;
  sqlite3_context *pCtx;
  sqlite3_value *in_RDX;
  undefined8 in_RDI;
  int iVal;
  u8 *zBlob;
  char *in_stack_ffffffffffffffd8;
  sqlite3_context *in_stack_ffffffffffffffe0;
  
  iVal = (int)((ulong)in_RDI >> 0x20);
  iVar1 = sqlite3_value_type((sqlite3_value *)(in_RDX->u).pDef);
  if ((iVar1 == 4) && (iVar1 = sqlite3_value_bytes((sqlite3_value *)0x295ee5), 1 < iVar1)) {
    pCtx = (sqlite3_context *)sqlite3_value_blob(in_RDX);
    if (pCtx == (sqlite3_context *)0x0) {
      sqlite3_result_error_nomem((sqlite3_context *)0x295f46);
    }
    else {
      readInt16((u8 *)pCtx);
      sqlite3_result_int(pCtx,iVal);
    }
  }
  else {
    sqlite3_result_error(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
  }
  return;
}

Assistant:

static void rtreedepth(sqlite3_context *ctx, int nArg, sqlite3_value **apArg){
  UNUSED_PARAMETER(nArg);
  if( sqlite3_value_type(apArg[0])!=SQLITE_BLOB
   || sqlite3_value_bytes(apArg[0])<2

  ){
    sqlite3_result_error(ctx, "Invalid argument to rtreedepth()", -1);
  }else{
    u8 *zBlob = (u8 *)sqlite3_value_blob(apArg[0]);
    if( zBlob ){
      sqlite3_result_int(ctx, readInt16(zBlob));
    }else{
      sqlite3_result_error_nomem(ctx);
    }
  }
}